

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_detached(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  init_process_options("spawn_helper4",detach_failure_cb);
  options.flags._0_1_ = (byte)options.flags | 8;
  uVar2 = uv_default_loop();
  iVar1 = uv_spawn(uVar2,&process,&options);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    uv_unref(&process);
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      eval_a = (int64_t)exit_cb_called;
      eval_b = 0;
      if (eval_a == 0) {
        eval_a = (int64_t)process.pid;
        iVar1 = uv_process_get_pid(&process);
        eval_b = (int64_t)iVar1;
        if (eval_a == eval_b) {
          iVar1 = uv_kill(process.pid,0);
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a == 0) {
            iVar1 = uv_kill(process.pid,0xf);
            eval_a = (int64_t)iVar1;
            eval_b = 0;
            if (eval_a == 0) {
              loop = (uv_loop_t *)uv_default_loop();
              close_loop(loop);
              eval_a = 0;
              uVar2 = uv_default_loop();
              iVar1 = uv_loop_close(uVar2);
              eval_b = (int64_t)iVar1;
              if (eval_b == 0) {
                uv_library_shutdown();
                return 0;
              }
              pcVar4 = "uv_loop_close(uv_default_loop())";
              pcVar3 = "0";
              uVar2 = 0x34f;
            }
            else {
              pcVar4 = "0";
              pcVar3 = "r";
              uVar2 = 0x34d;
            }
          }
          else {
            pcVar4 = "0";
            pcVar3 = "r";
            uVar2 = 0x34a;
          }
        }
        else {
          pcVar4 = "uv_process_get_pid(&process)";
          pcVar3 = "process.pid";
          uVar2 = 0x347;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "exit_cb_called";
        uVar2 = 0x345;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "r";
      uVar2 = 0x343;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "r";
    uVar2 = 0x33e;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(spawn_detached) {
  int r;

  init_process_options("spawn_helper4", detach_failure_cb);

  options.flags |= UV_PROCESS_DETACHED;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  uv_unref((uv_handle_t*) &process);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_OK(exit_cb_called);

  ASSERT_EQ(process.pid, uv_process_get_pid(&process));

  r = uv_kill(process.pid, 0);
  ASSERT_OK(r);

  r = uv_kill(process.pid, SIGTERM);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}